

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O2

bool __thiscall
ON_OffsetSurfaceFunction::EvaluateDistance
          (ON_OffsetSurfaceFunction *this,double s,double t,int num_der,double *value)

{
  uint uVar1;
  bool bVar2;
  int vi;
  ulong uVar3;
  double *value_00;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  double barray [21];
  
  iVar6 = (num_der + 2) * (num_der + 1);
  uVar7 = (long)iVar6 / 2;
  uVar3 = 0;
  uVar5 = 0;
  if (0 < (int)uVar7) {
    uVar5 = uVar7 & 0xffffffff;
  }
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    value[uVar3] = 0.0;
  }
  bVar2 = Initialize(this);
  if (bVar2) {
    if (iVar6 < 0x2c) {
      value_00 = barray;
    }
    else {
      value_00 = (double *)onmalloc((uVar7 & 0xffffffff) << 3);
    }
    uVar1 = (this->m_bumps).m_count;
    uVar3 = 0;
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = uVar3;
    }
    for (; uVar3 != uVar7; uVar3 = uVar3 + 1) {
      ON_BumpFunction::Evaluate((this->m_bumps).m_a + uVar3,s,t,num_der,value_00);
      for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        value[uVar4] = value_00[uVar4] + value[uVar4];
      }
    }
    if (value_00 != barray) {
      onfree(value_00);
    }
  }
  return bVar2;
}

Assistant:

bool ON_OffsetSurfaceFunction::EvaluateDistance(
      double s,
      double t,
      int num_der,
      double* value
      ) const
{
  const int vcnt = ((num_der+1)*(num_der+2))/2;
  for ( int vi = 0; vi < vcnt; vi++ )
  {
    value[vi] = 0;
  }

  bool rc = const_cast<ON_OffsetSurfaceFunction*>(this)->Initialize();

  if (rc)
  {
    double barray[21];
    double* bump_value = (vcnt > 21)
                       ? (double*)onmalloc(vcnt*sizeof(bump_value[0]))
                       : barray;
    const int bump_count = m_bumps.Count();
    int bump_index;
    for ( bump_index = 0; bump_index < bump_count; bump_index++ )
    {
      m_bumps[bump_index].Evaluate( s, t, num_der, bump_value );
      for ( int vi = 0; vi < vcnt; vi++ )
      {
        value[vi] += bump_value[vi];
      }
    }
    if ( bump_value != barray )
      onfree(bump_value);
  }
  return rc;
}